

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

void __thiscall
glslang::HlslGrammar::acceptArraySpecifier(HlslGrammar *this,TArraySizes **arraySizes)

{
  bool bVar1;
  bool bVar2;
  TArraySizes *pTVar3;
  size_t s;
  TArraySize pair;
  TIntermTyped *sizeExpr;
  TArraySize arraySize;
  TSourceLoc loc;
  
  *arraySizes = (TArraySizes *)0x0;
  s = 0x165;
  bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
  if (bVar1) {
    pTVar3 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,s);
    (pTVar3->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00a5b8c8;
    (pTVar3->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    pTVar3->implicitArraySize = 0;
    pTVar3->implicitlySized = true;
    pTVar3->variablyIndexed = false;
    *arraySizes = pTVar3;
    while (bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket),
          bVar1) {
      loc.column = (this->super_HlslTokenStream).token.loc.column;
      loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      loc.name = (this->super_HlslTokenStream).token.loc.name;
      loc.string = (this->super_HlslTokenStream).token.loc.string;
      loc.line = (this->super_HlslTokenStream).token.loc.line;
      sizeExpr = (TIntermTyped *)0x0;
      bVar1 = acceptAssignmentExpression(this,&sizeExpr);
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBracket);
      if (!bVar2) {
        expected(this,"]");
        return;
      }
      if (bVar1) {
        HlslParseContext::arraySizeCheck(this->parseContext,&loc,sizeExpr,&arraySize);
        pair._4_4_ = 0;
        pair.size = arraySize.size;
        pair.node = arraySize.node;
        TArraySizes::addInnerSize(*arraySizes,pair);
      }
      else {
        TArraySizes::addInnerSize(*arraySizes,0);
      }
    }
  }
  return;
}

Assistant:

void HlslGrammar::acceptArraySpecifier(TArraySizes*& arraySizes)
{
    arraySizes = nullptr;

    // Early-out if there aren't any array dimensions
    if (!peekTokenClass(EHTokLeftBracket))
        return;

    // If we get here, we have at least one array dimension.  This will track the sizes we find.
    arraySizes = new TArraySizes;

    // Collect each array dimension.
    while (acceptTokenClass(EHTokLeftBracket)) {
        TSourceLoc loc = token.loc;
        TIntermTyped* sizeExpr = nullptr;

        // Array sizing expression is optional.  If omitted, array will be later sized by initializer list.
        const bool hasArraySize = acceptAssignmentExpression(sizeExpr);

        if (! acceptTokenClass(EHTokRightBracket)) {
            expected("]");
            return;
        }

        if (hasArraySize) {
            TArraySize arraySize;
            parseContext.arraySizeCheck(loc, sizeExpr, arraySize);
            arraySizes->addInnerSize(arraySize);
        } else {
            arraySizes->addInnerSize(0);  // sized by initializers.
        }
    }
}